

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int mbedtls_x509_get_name(uchar **p,uchar *end,mbedtls_x509_name *cur)

{
  uchar *puVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  mbedtls_asn1_named_data *pmVar5;
  byte *pbVar6;
  byte *end_00;
  uchar *end_01;
  mbedtls_x509_name *pmVar7;
  size_t local_50;
  mbedtls_x509_name *local_48;
  uchar *local_40;
  size_t local_38;
  size_t set_len;
  
  local_48 = cur;
  local_40 = end;
LAB_0021aa44:
  iVar3 = mbedtls_asn1_get_tag(p,end,&local_38,0x31);
  if (iVar3 == 0) {
    end_01 = *p + local_38;
    pmVar7 = cur;
    do {
      iVar3 = mbedtls_asn1_get_tag(p,end_01,&local_50,0x30);
      if (iVar3 == 0) {
        iVar3 = -0x23e0;
        if (0 < (long)local_50) {
          end_00 = *p + local_50;
          (pmVar7->oid).tag = (uint)**p;
          iVar4 = mbedtls_asn1_get_tag(p,end_00,&(pmVar7->oid).len,6);
          if (iVar4 == 0) {
            (pmVar7->oid).p = *p;
            pbVar6 = *p + (pmVar7->oid).len;
            *p = pbVar6;
            if (end_00 != pbVar6 && -1 < (long)end_00 - (long)pbVar6) {
              iVar3 = -0x23e2;
              if ((*pbVar6 < 0x1f) && ((0x50581008U >> (*pbVar6 & 0x1f) & 1) != 0)) {
                *p = pbVar6 + 1;
                (pmVar7->val).tag = (uint)*pbVar6;
                iVar3 = mbedtls_asn1_get_len(p,end_00,&(pmVar7->val).len);
                if (iVar3 != 0) goto LAB_0021aa7e;
                (pmVar7->val).p = *p;
                puVar1 = *p;
                sVar2 = (pmVar7->val).len;
                *p = puVar1 + sVar2;
                iVar3 = -0x23e6;
                if (puVar1 + sVar2 == end_00) {
                  pmVar7->next = (mbedtls_asn1_named_data *)0x0;
                  iVar3 = 0;
                }
              }
            }
          }
          else {
            iVar3 = iVar4 + -0x2380;
          }
        }
      }
      else {
LAB_0021aa7e:
        iVar3 = iVar3 + -0x2380;
      }
      end = local_40;
      if (iVar3 != 0) goto LAB_0021abc7;
      if (*p == end_01) goto LAB_0021ab95;
      pmVar7->next_merged = '\x01';
      pmVar5 = (mbedtls_asn1_named_data *)calloc(1,0x40);
      pmVar7->next = pmVar5;
      pmVar7 = pmVar5;
      if (pmVar5 == (mbedtls_asn1_named_data *)0x0) goto LAB_0021abc1;
    } while( true );
  }
  iVar3 = iVar3 + -0x2380;
  goto LAB_0021abc7;
LAB_0021ab95:
  if (*p == local_40) {
    return 0;
  }
  cur = (mbedtls_x509_name *)calloc(1,0x40);
  pmVar7->next = cur;
  if (cur == (mbedtls_asn1_named_data *)0x0) {
LAB_0021abc1:
    iVar3 = -0x2880;
LAB_0021abc7:
    pmVar7 = local_48;
    mbedtls_asn1_free_named_data_list_shallow(local_48->next);
    pmVar7->next = (mbedtls_asn1_named_data *)0x0;
    return iVar3;
  }
  goto LAB_0021aa44;
}

Assistant:

int mbedtls_x509_get_name(unsigned char **p, const unsigned char *end,
                          mbedtls_x509_name *cur)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t set_len;
    const unsigned char *end_set;
    mbedtls_x509_name *head = cur;

    /* don't use recursion, we'd risk stack overflow if not optimized */
    while (1) {
        /*
         * parse SET
         */
        if ((ret = mbedtls_asn1_get_tag(p, end, &set_len,
                                        MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SET)) != 0) {
            ret = MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_NAME, ret);
            goto error;
        }

        end_set  = *p + set_len;

        while (1) {
            if ((ret = x509_get_attr_type_value(p, end_set, cur)) != 0) {
                goto error;
            }

            if (*p == end_set) {
                break;
            }

            /* Mark this item as being no the only one in a set */
            cur->next_merged = 1;

            cur->next = mbedtls_calloc(1, sizeof(mbedtls_x509_name));

            if (cur->next == NULL) {
                ret = MBEDTLS_ERR_X509_ALLOC_FAILED;
                goto error;
            }

            cur = cur->next;
        }

        /*
         * continue until end of SEQUENCE is reached
         */
        if (*p == end) {
            return 0;
        }

        cur->next = mbedtls_calloc(1, sizeof(mbedtls_x509_name));

        if (cur->next == NULL) {
            ret = MBEDTLS_ERR_X509_ALLOC_FAILED;
            goto error;
        }

        cur = cur->next;
    }

error:
    /* Skip the first element as we did not allocate it */
    mbedtls_asn1_free_named_data_list_shallow(head->next);
    head->next = NULL;

    return ret;
}